

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O2

void __thiscall
ktx::CommandExtract::saveEXR
          (CommandExtract *this,string *filepath,bool appendExtension,VkFormat vkFormat,
          FormatDescriptor *format,uint32_t width,uint32_t height,
          vector<int,_std::allocator<int>_> *pixelTypes,char *data,size_t size)

{
  int iVar1;
  pointer piVar2;
  pointer pCVar3;
  pointer p_Var4;
  bool bVar5;
  char cVar6;
  int iVar7;
  uint rawBits;
  uint32_t uVar8;
  uint32_t uVar9;
  ulong uVar10;
  EXRChannelInfo *__dest;
  int *piVar11;
  EXRAttribute *pEVar12;
  void *__buf;
  uint uVar13;
  uint uVar14;
  size_type __n;
  khr_df_model_e model;
  khr_df_model_e extraout_EDX;
  khr_df_model_e extraout_EDX_00;
  VkFormat format_00;
  undefined7 in_register_00000011;
  ulong uVar15;
  size_t __size;
  long lVar16;
  long lVar17;
  size_type sVar18;
  uint **ppuVar19;
  Reporter *report;
  float fVar20;
  vec3 vVar21;
  vector<Channel,_std::allocator<Channel>_> channels;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  images;
  EXRStruct exr;
  array<unsigned_int_*,_4UL> imagePtrs;
  Primaries primaries;
  OutputStream file;
  char local_140 [256];
  Primaries *local_40;
  undefined8 local_38;
  
  model = (khr_df_model_e)CONCAT71(in_register_00000011,appendExtension);
  if ((format->samples).
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (format->samples).
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("!format.samples.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x367,
                  "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                 );
  }
  if ((appendExtension) && (bVar5 = std::operator!=(filepath,"-"), model = extraout_EDX, bVar5)) {
    std::__cxx11::string::append((char *)filepath);
    model = extraout_EDX_00;
  }
  channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (*(byte *)&format->basic == 1) {
    file.filepath._M_string_length = (size_type)&channels;
    file.filepath._M_dataplus._M_p = (pointer)format;
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()(&file,KHR_DF_CHANNEL_BC2_ALPHA,"A");
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()(&file,KHR_DF_CHANNEL_COMMON_D,"D");
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()(&file,KHR_DF_CHANNEL_COMMON_S,"S");
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()(&file,KHR_DF_CHANNEL_CIEXYY_YLUMA,"B");
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()(&file,KHR_DF_CHANNEL_BC1A_ALPHA,"G");
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()(&file,KHR_DF_CHANNEL_ASTC_DATA,"R");
  }
  else {
    toString_abi_cxx11_(&file.filepath,(ktx *)(ulong)*(byte *)&format->basic,model);
    toString_abi_cxx11_((string *)&exr,(ktx *)(ulong)vkFormat,format_00);
    Reporter::fatal<char_const(&)[42],std::__cxx11::string,std::__cxx11::string>
              (&(this->super_Command).super_Reporter,NOT_SUPPORTED,
               (char (*) [42])"EXR saving is unsupported for {} with {}.",&file.filepath,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exr);
    std::__cxx11::string::~string((string *)&exr);
    std::__cxx11::string::~string((string *)&file);
  }
  uVar13 = (uint)(byte)(format->basic).field_0x8;
  if (vkFormat == VK_FORMAT_E5B9G9R9_UFLOAT_PACK32) {
    __n = 3;
  }
  else {
    __n = (size_type)(format->extended).channelCount;
  }
  if (uVar13 * height * width != size) {
    __assert_fail("size == width * height * pixelBytes",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x392,
                  "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                 );
  }
  if ((long)(pixelTypes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pixelTypes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 != __n) {
    __assert_fail("numChannels == pixelTypes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x393,
                  "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                 );
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&images,__n,(allocator_type *)&file);
  imagePtrs._M_elems[2] = (uint *)0x0;
  imagePtrs._M_elems[3] = (uint *)0x0;
  imagePtrs._M_elems[0] = (uint *)0x0;
  imagePtrs._M_elems[1] = (uint *)0x0;
  for (lVar17 = 0; __n * 0x18 - lVar17 != 0; lVar17 = lVar17 + 0x18) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&((images.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar17),(ulong)(height * width));
  }
  uVar9 = 0;
  do {
    iVar7 = (int)__n;
    if (uVar9 == height) {
      exr.attributes.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      exr.err = (char *)0x0;
      exr.attributes.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      exr.attributes.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      exr.fileData = (uchar *)0x0;
      InitEXRHeader(&exr.header);
      InitEXRImage(&exr.image);
      ppuVar19 = imagePtrs._M_elems;
      exr.image.height = height;
      exr.header.num_channels = iVar7;
      exr.image.images = (uchar **)ppuVar19;
      exr.image.width = width;
      exr.image.num_channels = iVar7;
      __dest = (EXRChannelInfo *)malloc((long)iVar7 * 0x110);
      pCVar3 = channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
               super__Vector_impl_data._M_start;
      exr.header.compression_type = 0;
      exr.header.channels = __dest;
      for (lVar17 = 0; __n * 3 != lVar17; lVar17 = lVar17 + 3) {
        strncpy(__dest->name,(&pCVar3->name)[lVar17],0xff);
        *ppuVar19 = (&((images.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start)[lVar17];
        __dest = __dest + 1;
        ppuVar19 = ppuVar19 + 1;
      }
      __size = (long)iVar7 << 2;
      piVar11 = (int *)malloc(__size);
      exr.header.pixel_types = piVar11;
      exr.header.requested_pixel_types = (int *)malloc(__size);
      piVar2 = (pixelTypes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar18 = 0;
      if (iVar7 < 1) {
        __n = sVar18;
      }
      for (; __n != sVar18; sVar18 = sVar18 + 1) {
        piVar11[sVar18] = (uint)(piVar2[sVar18] != 0) * 2;
        exr.header.requested_pixel_types[sVar18] = piVar2[sVar18];
      }
      cVar6 = getPrimaries((format->basic).field_0x1,&primaries);
      if (cVar6 != '\0') {
        local_38._0_4_ = 0;
        local_38._4_4_ = 0;
        strncpy((char *)&file,"chromaticities",0x100);
        strncpy(local_140,"chromaticities",0x100);
        local_38._0_4_ = 0x20;
        local_40 = &primaries;
        std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::push_back
                  (&exr.attributes,(value_type *)&file);
      }
      p_Var4 = exr.attributes.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar17 = ((long)exr.attributes.
                      super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)exr.attributes.
                     super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x210;
      exr.header.num_custom_attributes = (int)lVar17;
      pEVar12 = (EXRAttribute *)
                malloc((long)exr.attributes.
                             super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)exr.attributes.
                             super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
                             _M_impl.super__Vector_impl_data._M_start);
      lVar16 = 0;
      exr.header.custom_attributes = pEVar12;
      while (bVar5 = lVar17 != 0, lVar17 = lVar17 + -1, bVar5) {
        memcpy(pEVar12->name + lVar16,p_Var4->name + lVar16,0x210);
        lVar16 = lVar16 + 0x210;
      }
      __buf = (void *)SaveEXRImageToMemory(&exr.image,&exr.header,&exr.fileData,&exr.err);
      if (__buf == (void *)0x0) {
        Reporter::fatal<char_const(&)[23],char_const*&>
                  (&(this->super_Command).super_Reporter,IO_FAILURE,
                   (char (*) [23])"EXR Encoder error: {}.",&exr.err);
      }
      report = &(this->super_Command).super_Reporter;
      OutputStream::OutputStream(&file,filepath,report);
      OutputStream::write(&file,(int)exr.fileData,__buf,(size_t)report);
      OutputStream::~OutputStream(&file);
      saveEXR::EXRStruct::~EXRStruct(&exr);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&images);
      std::vector<Channel,_std::allocator<Channel>_>::~vector(&channels);
      return;
    }
    for (uVar15 = 0; uVar15 != width; uVar15 = uVar15 + 1) {
      uVar14 = uVar9 * width + (int)uVar15;
      uVar10 = (ulong)uVar14;
      if (vkFormat == VK_FORMAT_E5B9G9R9_UFLOAT_PACK32) {
        if (iVar7 != 3) {
          __assert_fail("numChannels == 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                        ,0x3a2,
                        "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                       );
        }
        if (*(pixelTypes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start != 1) {
          __assert_fail("pixelTypes[0] == TINYEXR_PIXELTYPE_HALF",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                        ,0x3a3,
                        "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                       );
        }
        vVar21 = glm::unpackF3x9_E1x5(*(uint32 *)(data + uVar14 * uVar13));
        images.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[2].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10] = vVar21.field_0._0_4_;
        images.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10] = vVar21.field_0._4_4_;
        ((images.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar10] = vVar21.field_0._8_4_;
      }
      else {
        lVar17 = 0;
        for (sVar18 = 0;
            pCVar3 = channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                     super__Vector_impl_data._M_start, __n != sVar18; sVar18 = sVar18 + 1) {
          uVar8 = *(uint32_t *)
                   ((long)&(channels.super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                            super__Vector_impl_data._M_start)->bits + lVar17);
          rawBits = imageio::extract_bits<unsigned_int>
                              (data + uVar14 * uVar13,
                               *(uint32_t *)
                                ((long)&(channels.
                                         super__Vector_base<Channel,_std::allocator<Channel>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->offset + lVar17)
                               ,uVar8);
          lVar16 = *(long *)((long)&((images.
                                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_start + lVar17);
          iVar1 = (pixelTypes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[sVar18];
          if (iVar1 - 1U < 2) {
            if ((&pCVar3->isFloat)[lVar17] == true) {
              if ((&pCVar3->isSigned)[lVar17] == true) {
                fVar20 = imageio::convertSFloatToFloat(rawBits,uVar8);
              }
              else {
                fVar20 = imageio::convertUFloatToFloat(rawBits,uVar8);
              }
            }
            else if ((&pCVar3->isNormalized)[lVar17] == true) {
              if ((&pCVar3->isSigned)[lVar17] == false) {
                fVar20 = imageio::convertUNORMToFloat(rawBits,uVar8);
              }
              else {
                fVar20 = imageio::convertSNORMToFloat(rawBits,uVar8);
              }
            }
            else if ((&pCVar3->isSigned)[lVar17] == false) {
              fVar20 = imageio::convertUIntToFloat(rawBits,uVar8);
            }
            else {
              fVar20 = imageio::convertSIntToFloat(rawBits,uVar8);
            }
            *(float *)(lVar16 + uVar10 * 4) = fVar20;
          }
          else {
            if (iVar1 != 0) {
              __assert_fail("false && \"Internal error\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                            ,0x3d1,
                            "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                           );
            }
            if ((&pCVar3->isFloat)[lVar17] == true) {
              if ((&pCVar3->isSigned)[lVar17] == false) {
                uVar8 = imageio::convertUFloatToUInt(rawBits,uVar8);
              }
              else {
                uVar8 = imageio::convertSFloatToUInt(rawBits,uVar8);
              }
            }
            else if ((&pCVar3->isSigned)[lVar17] == false) {
              uVar8 = imageio::convertUIntToUInt(rawBits,uVar8);
            }
            else {
              uVar8 = imageio::convertSIntToUInt(rawBits,uVar8);
            }
            *(uint32_t *)(lVar16 + uVar10 * 4) = uVar8;
          }
          lVar17 = lVar17 + 0x18;
        }
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void CommandExtract::saveEXR(std::string filepath, bool appendExtension,
        VkFormat vkFormat, const FormatDescriptor& format, uint32_t width, uint32_t height,
        const std::vector<int>& pixelTypes, const char* data, std::size_t size) {
    assert(!format.samples.empty());

    if (appendExtension && filepath != "-")
        filepath += ".exr";

    struct Channel {
        uint32_t offset;
        uint32_t bits;
        const char* name;
        bool isFloat;
        bool isSigned;
        bool isNormalized;
    };
    std::vector<Channel> channels;

    if (format.model() == KHR_DF_MODEL_RGBSDA) {
        const auto addChannel = [&](auto channelType, const char* channelName) {
            if (const auto sample = format.find(channelType))
                channels.push_back({
                        sample->bitOffset,
                        sample->bitLength + 1u,
                        channelName,
                        sample->qualifierFloat != 0,
                        sample->qualifierSigned != 0,
                        sample->upper != (sample->qualifierFloat != 0 ? bit_cast<uint32_t>(1.0f) : 1u)
                });
        };

        // Must be ABGR order, since most of EXR viewers expect this channel order by convention.
        addChannel(KHR_DF_CHANNEL_RGBSDA_A, "A");
        addChannel(KHR_DF_CHANNEL_RGBSDA_D, "D");
        addChannel(KHR_DF_CHANNEL_RGBSDA_S, "S");
        addChannel(KHR_DF_CHANNEL_RGBSDA_B, "B");
        addChannel(KHR_DF_CHANNEL_RGBSDA_G, "G");
        addChannel(KHR_DF_CHANNEL_RGBSDA_R, "R");
    // } else if (formatDescriptor.model() == KHR_DF_MODEL_YUVSDA) {
    // Other color model support would come here
    } else {
        fatal(rc::NOT_SUPPORTED, "EXR saving is unsupported for {} with {}.", toString(format.model()), toString(vkFormat));
    }

    const auto pixelBytes = format.pixelByteCount();
    const auto numChannels = vkFormat == VK_FORMAT_E5B9G9R9_UFLOAT_PACK32 ? 3 : format.channelCount();
    assert(size == width * height * pixelBytes); (void) size;
    assert(numChannels == pixelTypes.size());

    // Image data is prepared with either floats or uint32
    // (half output is will be converted from float by TinyEXR during save)
    std::vector<std::vector<uint32_t>> images(numChannels);
    std::array<uint32_t*, 4> imagePtrs{};
    for (uint32_t i = 0; i < numChannels; ++i)
        images[i].resize(width * height);

    for (uint32_t y = 0; y < height; y++) {
        for (uint32_t x = 0; x < width; x++) {
            const char* rawPixel = data + (y * width + x) * pixelBytes;

            if (vkFormat == VK_FORMAT_E5B9G9R9_UFLOAT_PACK32) {
                // Special case for VK_FORMAT_E5B9G9R9_UFLOAT_PACK32
                assert(numChannels == 3);
                assert(pixelTypes[0] == TINYEXR_PIXELTYPE_HALF);
                uint32_t pixel;
                std::memcpy(&pixel, rawPixel, sizeof(uint32_t));
                const auto values = glm::unpackF3x9_E1x5(pixel);
                images[2][y * width + x] = bit_cast<uint32_t>(values.r);
                images[1][y * width + x] = bit_cast<uint32_t>(values.g);
                images[0][y * width + x] = bit_cast<uint32_t>(values.b);
            } else {
                for (uint32_t c = 0; c < numChannels; c++) {
                    const auto& channel = channels[c];
                    const auto offset = channel.offset;
                    const auto bits = channel.bits;

                    const auto value = extract_bits<uint32_t>(rawPixel, offset, bits);
                    auto& target = images[c][y * width + x];

                    if (pixelTypes[c] == TINYEXR_PIXELTYPE_FLOAT || pixelTypes[c] == TINYEXR_PIXELTYPE_HALF) {
                        if (channel.isFloat) {
                            if (channel.isSigned)
                                target = bit_cast<uint32_t>(convertSFloatToFloat(value, bits));
                            else
                                target = bit_cast<uint32_t>(convertUFloatToFloat(value, bits));
                        } else {
                            if (channel.isNormalized) {
                                if (channel.isSigned)
                                    target = bit_cast<uint32_t>(convertSNORMToFloat(value, bits));
                                else
                                    target = bit_cast<uint32_t>(convertUNORMToFloat(value, bits));
                            } else {
                                if (channel.isSigned)
                                    target = bit_cast<uint32_t>(convertSIntToFloat(value, bits));
                                else
                                    target = bit_cast<uint32_t>(convertUIntToFloat(value, bits));
                            }
                        }
                    } else if (pixelTypes[c] == TINYEXR_PIXELTYPE_UINT) {
                        if (channel.isFloat && channel.isSigned) {
                            target = convertSFloatToUInt(value, bits);
                        } else if (channel.isFloat && !channel.isSigned) {
                            target = convertUFloatToUInt(value, bits);
                        } else if (!channel.isFloat && channel.isSigned) {
                            target = convertSIntToUInt(value, bits);
                        } else if (!channel.isFloat && !channel.isSigned) {
                            target = convertUIntToUInt(value, bits);
                        }
                    } else
                        assert(false && "Internal error");
                }
            }
        }
    }

    struct EXRStruct {
        EXRHeader header;
        EXRImage image;
        std::vector<EXRAttribute> attributes;
        const char* err = nullptr;
        unsigned char* fileData = nullptr;
        EXRStruct() {
            InitEXRHeader(&header);
            InitEXRImage(&image);
        }
        ~EXRStruct() {
            if (header.custom_attributes != nullptr) {
                free(header.custom_attributes);
                header.custom_attributes = nullptr;
                header.num_custom_attributes = 0;
            }
            image.images = nullptr; // null out the images to stop TinyEXR from trying to free them
            FreeEXRImage(&image);
            FreeEXRHeader(&header);
            FreeEXRErrorMessage(err);
            free(fileData);
        }
        void addAttributesToHeader() {
            header.num_custom_attributes = static_cast<int>(attributes.size());
            header.custom_attributes = (EXRAttribute*)malloc(sizeof(EXRAttribute) * attributes.size());
            for (size_t i = 0; i < attributes.size(); ++i) {
                header.custom_attributes[i] = attributes[i];
            }
        }
    } exr;

    exr.image.images = reinterpret_cast<unsigned char**>(imagePtrs.data());
    exr.image.width = static_cast<int>(width);
    exr.image.height = static_cast<int>(height);
    exr.image.num_channels = static_cast<int>(numChannels);

    exr.header.num_channels = static_cast<int>(numChannels);
    exr.header.channels = (EXRChannelInfo*) malloc(sizeof(EXRChannelInfo) * exr.header.num_channels);
    // TODO: Question: Should we use a compression for exr outputs?
    exr.header.compression_type = TINYEXR_COMPRESSIONTYPE_NONE;

    for (uint32_t c = 0; c < numChannels; c++) {
        const auto& channel = channels[c];
        strncpy(exr.header.channels[c].name, channel.name, 255);
        imagePtrs[c] = images[c].data();
    }

    exr.header.pixel_types = (int *)malloc(sizeof(int) * exr.header.num_channels);
    exr.header.requested_pixel_types = (int *)malloc(sizeof(int) * exr.header.num_channels);
    for (int i = 0; i < exr.header.num_channels; i++) {
        // pixel type of the input image
        exr.header.pixel_types[i] = (pixelTypes[i] == TINYEXR_PIXELTYPE_UINT) ? TINYEXR_PIXELTYPE_UINT : TINYEXR_PIXELTYPE_FLOAT;
        // pixel type of the output image to be stored in .EXR file
        exr.header.requested_pixel_types[i] = pixelTypes[i];
    }

    // Output primaries as chromaticities
    Primaries primaries;
    bool foundPrimaries = getPrimaries(format.primaries(), &primaries);
    if (foundPrimaries) {
        EXRAttribute chromaticities{};
        strncpy(chromaticities.name, "chromaticities", sizeof(chromaticities.name));
        strncpy(chromaticities.type, "chromaticities", sizeof(chromaticities.type));
        chromaticities.size = sizeof(primaries);
        chromaticities.value = reinterpret_cast<unsigned char*>(&primaries);

        exr.attributes.push_back(chromaticities);
    }

    exr.addAttributesToHeader();
    std::size_t fileDataSize = SaveEXRImageToMemory(&exr.image, &exr.header, &exr.fileData, &exr.err);
    if (fileDataSize == 0)
        fatal(rc::IO_FAILURE, "EXR Encoder error: {}.", exr.err);

    OutputStream file(filepath, *this);
    file.write(reinterpret_cast<const char*>(exr.fileData), fileDataSize, *this);
}